

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

void __thiscall Clasp::WeightConstraint::destroy(WeightConstraint *this,Solver *s,bool detach)

{
  uint32 uVar1;
  byte in_DL;
  WL *in_RSI;
  Literal *in_RDI;
  Solver *unaff_retaddr;
  void *mem;
  uint32 dl;
  uint32 last;
  uint32 end;
  uint32 i;
  Literal *in_stack_ffffffffffffffa8;
  WL *in_stack_ffffffffffffffb0;
  Solver *in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffd0;
  Literal in_stack_ffffffffffffffd8;
  Literal in_stack_ffffffffffffffdc;
  uint32 local_18;
  WL *c;
  Literal *p;
  
  if ((in_RSI != (WL *)0x0) && ((in_DL & 1) != 0)) {
    local_18 = 0;
    p = in_RDI;
    uVar1 = size((WeightConstraint *)0x217b29);
    for (; local_18 != uVar1; local_18 = local_18 + 1) {
      c = in_RSI;
      WL::lit(*(WL **)(in_RDI + 2),local_18);
      Solver::removeWatch(unaff_retaddr,p,(Constraint *)c);
      in_stack_ffffffffffffffd8 = WL::lit(*(WL **)(in_RDI + 2),local_18);
      in_stack_ffffffffffffffdc = Literal::operator~(in_stack_ffffffffffffffa8);
      Solver::removeWatch(unaff_retaddr,p,(Constraint *)c);
      in_stack_ffffffffffffffb0 = in_RSI;
      in_RSI = c;
    }
    uVar1 = 0;
    while (in_stack_ffffffffffffffd0 =
                highestUndoLevel((WeightConstraint *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffc8), in_stack_ffffffffffffffd0 != 0) {
      if (in_stack_ffffffffffffffd0 != uVar1) {
        uVar1 = in_stack_ffffffffffffffd0;
        Solver::removeUndoWatch
                  ((Solver *)CONCAT44(in_stack_ffffffffffffffdc.rep_,in_stack_ffffffffffffffd8.rep_)
                   ,in_stack_ffffffffffffffd0,(Constraint *)in_stack_ffffffffffffffc8);
      }
      in_RDI[4].rep_ = in_RDI[4].rep_ & 0xf8000000 | (in_RDI[4].rep_ & 0x7ffffff) - 1 & 0x7ffffff;
    }
  }
  if ((in_RDI[4].rep_ >> 0x1b & 1) == 0) {
    WL::release(in_stack_ffffffffffffffb0);
  }
  (**(code **)(*(long *)in_RDI + 0x80))();
  operator_delete(in_RDI);
  return;
}

Assistant:

void WeightConstraint::destroy(Solver* s, bool detach) {
	if (s && detach) {
		for (uint32 i = 0, end = size(); i != end; ++i) {
			s->removeWatch( lits_->lit(i), this );
			s->removeWatch(~lits_->lit(i), this );
		}
		for (uint32 last = 0, dl; (dl = highestUndoLevel(*s)) != 0; --up_) {
			if (dl != last) { s->removeUndoWatch(last = dl, this); }
		}
	}
	if (ownsLit_ == 0) { lits_->release(); }
	void* mem = static_cast<Constraint*>(this);
	this->~WeightConstraint();
	::operator delete(mem);
}